

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brent.c
# Opt level: O2

double brent_local_min(custom_funcuni *funcuni,double a,double b,double t,double eps,double *x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_98;
  
  dVar4 = (b - a) * 0.3819660112501051 + a;
  *x = dVar4;
  dVar2 = (*funcuni->funcuni)(dVar4,funcuni->params);
  dVar3 = a + b;
  dVar15 = *x;
  dVar16 = 0.0;
  dVar11 = dVar2;
  dVar13 = dVar2;
  dVar8 = dVar4;
  do {
    dVar5 = ABS(dVar15) * eps + t;
    dVar6 = dVar5 + dVar5;
    dVar3 = dVar3 * 0.5;
    if (ABS(dVar15 - dVar3) <= (b - a) * -0.5 + dVar6) {
      return dVar2;
    }
    dVar9 = 0.0;
    if (ABS(dVar16) <= dVar5) {
      dVar12 = 0.0;
      dVar7 = 0.0;
      local_98 = dVar16;
    }
    else {
      dVar9 = (dVar2 - dVar11) * (dVar15 - dVar8);
      dVar7 = (dVar2 - dVar13) * (dVar15 - dVar4);
      dVar12 = (dVar15 - dVar4) * dVar7 - (dVar15 - dVar8) * dVar9;
      dVar7 = dVar7 - dVar9;
      dVar7 = dVar7 + dVar7;
      dVar14 = -dVar7;
      dVar9 = (double)(~-(ulong)(dVar14 < dVar7) & (ulong)dVar12 |
                      (ulong)-dVar12 & -(ulong)(dVar14 < dVar7));
      dVar12 = dVar16;
      if (dVar7 <= dVar14) {
        dVar7 = dVar14;
      }
    }
    if (((ABS(dVar7 * 0.5 * dVar12) <= ABS(dVar9)) || ((a - dVar15) * dVar7 <= dVar9)) ||
       ((b - dVar15) * dVar7 <= dVar9)) {
      dVar16 = (double)(~-(ulong)(dVar15 < dVar3) & (ulong)a | -(ulong)(dVar15 < dVar3) & (ulong)b)
               - dVar15;
      dVar9 = dVar16 * 0.3819660112501051;
    }
    else {
      dVar12 = dVar15 + dVar9 / dVar7;
      dVar16 = local_98;
      if (((dVar12 - a < dVar6) || (dVar9 = dVar9 / dVar7, b - dVar12 < dVar6)) &&
         (dVar9 = dVar5, dVar3 <= dVar15)) {
        dVar9 = -dVar5;
      }
    }
    if (dVar5 <= ABS(dVar9)) {
      dVar5 = dVar15 + dVar9;
    }
    else if (dVar9 <= 0.0) {
      dVar5 = dVar15 - dVar5;
    }
    else {
      dVar5 = dVar5 + dVar15;
    }
    dVar12 = (*funcuni->funcuni)(dVar5,funcuni->params);
    dVar3 = *x;
    uVar1 = -(ulong)(dVar5 < dVar3);
    dVar6 = dVar8;
    if (dVar12 <= dVar2) {
      dVar7 = a;
      if (dVar3 <= dVar5) {
        dVar7 = dVar3;
      }
      b = (double)(~uVar1 & (ulong)b | uVar1 & (ulong)dVar3);
      *x = dVar5;
      dVar14 = dVar2;
      dVar2 = dVar12;
      dVar15 = dVar5;
      dVar10 = dVar3;
    }
    else {
      dVar7 = dVar5;
      if (dVar3 <= dVar5) {
        dVar7 = a;
      }
      b = (double)((ulong)b & uVar1 | ~uVar1 & (ulong)dVar5);
      dVar14 = dVar12;
      dVar15 = dVar3;
      dVar10 = dVar5;
      if (dVar13 < dVar12) {
        if ((dVar8 != dVar3) || (NAN(dVar8) || NAN(dVar3))) {
          dVar14 = dVar13;
          dVar10 = dVar8;
          if (dVar11 < dVar12) {
            if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
              dVar13 = dVar11;
              dVar6 = dVar4;
              if ((dVar4 != dVar8) || (NAN(dVar4) || NAN(dVar8))) goto LAB_001359ed;
            }
          }
          dVar13 = dVar12;
          dVar6 = dVar5;
        }
      }
    }
LAB_001359ed:
    dVar3 = b + dVar7;
    dVar11 = dVar13;
    dVar4 = dVar6;
    dVar13 = dVar14;
    a = dVar7;
    dVar8 = dVar10;
    local_98 = dVar9;
  } while( true );
}

Assistant:

double brent_local_min(custom_funcuni *funcuni, double a, double b, double t, double eps, double *x) {
	double c,d,e,m,p,q,r,tol,t2;
	double u,v,w,fu,fv,fw,fx;
	double fd;
	
	fd = eps;
	
	c = (3.0 - sqrt(5.0)) / 2.0;
	*x = a + c * (b - a);
	w = *x; v = w;
	e = 0;
	fx = FUNCUNI_EVAL(funcuni,*x);
	fw = fx; fv = fw;
	
	m = 0.5 * (a + b);
	tol = fd * fabs(*x) + t;
	t2 = 2.0 * tol;
	
	while (fabs(*x - m) > t2 - 0.5 * (b - a)) {
		p = 0; q = 0; r = 0;
		
		if (fabs(e) > tol) {
			r = (*x - w) * (fx - fv);
			q = (*x - v) * (fx - fw);
			p = (*x - v) * q - (*x - w) * r;
			q = 2.0 * (q - r);
			if (q > 0.0) {
				p = -p;
			} else {
				q = -q;
			}
			r = e;
			e = d;
		}
		
		if (fabs(p) < fabs(0.5 * q * r) && p < q * (a - *x) && p < q * (b - *x)) {
			d = p / q;
			u = *x + d;
			
			if ( (u - a) < t2 || (b - u) < t2) {
				if (*x < m) {
					d = tol;
				} else {
					d = -tol;
				}
			}
		} else {
			if (*x < m) {
				e = b - *x;
			} else {
				e = a - *x;
			}
			d = c * e;
		}
		
		if (fabs(d) >= tol) {
			u = *x + d;
		} else if (d > 0) {
			u = *x + tol;
		} else {
			u = *x - tol;
		}
		
		fu = FUNCUNI_EVAL(funcuni,u);
		
		if (fu <= fx) {
			if (u < *x) {
				b = *x;
			} else {
				a = *x;
			}
			v = w;
			fv = fw;
			w = *x;
			fw = fx;
			*x = u;
			fx = fu;
		} else {
			if (u < *x) {
				a = u;
			} else {
				b = u;
			}
			if (fu <= fw || w == *x) {
				v = w;
				fv = fw;
				w = u;
				fw = fu;
			} else if (fu <= fv || v == *x || v == w) {
				v = u;
				fv = fu;
			}
		}
		
		//End of the loop
		m = 0.5 * (a + b);
		tol = fd * fabs(*x) + t;
		t2 = 2.0 * tol;
		
	}
	
	return fx;
}